

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

void subelems_deallocator(size_t count,yin_subelement *subelems)

{
  ulong local_20;
  size_t i;
  yin_subelement *subelems_local;
  size_t count_local;
  
  for (local_20 = 0; local_20 < count; local_20 = local_20 + 1) {
    if (((((((subelems[local_20].type == LY_STMT_ANYXML) ||
            (subelems[local_20].type == LY_STMT_ANYDATA)) ||
           (subelems[local_20].type == LY_STMT_LEAF)) ||
          ((subelems[local_20].type == LY_STMT_LEAF_LIST ||
           (subelems[local_20].type == LY_STMT_TYPEDEF)))) ||
         ((subelems[local_20].type == LY_STMT_USES ||
          ((subelems[local_20].type == LY_STMT_LIST ||
           (subelems[local_20].type == LY_STMT_NOTIFICATION)))))) ||
        (subelems[local_20].type == LY_STMT_GROUPING)) ||
       (((((subelems[local_20].type == LY_STMT_CONTAINER ||
           (subelems[local_20].type == LY_STMT_CASE)) || (subelems[local_20].type == LY_STMT_CHOICE)
          ) || (((subelems[local_20].type == LY_STMT_ACTION ||
                 (subelems[local_20].type == LY_STMT_RPC)) ||
                ((subelems[local_20].type == LY_STMT_AUGMENT ||
                 ((subelems[local_20].type == LY_STMT_IMPORT ||
                  (subelems[local_20].type == LY_STMT_INCLUDE)))))))) ||
        ((subelems[local_20].type == LY_STMT_INPUT || (subelems[local_20].type == LY_STMT_OUTPUT))))
       )) {
      free(subelems[local_20].dest);
    }
  }
  free(subelems);
  return;
}

Assistant:

static void
subelems_deallocator(size_t count, struct yin_subelement *subelems)
{
    for (size_t i = 0; i < count; ++i) {
        if (HAS_META(subelems[i].type)) {
            free(subelems[i].dest);
        }
    }

    free(subelems);
}